

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_gen.c
# Opt level: O0

int rsa_keygen(OSSL_LIB_CTX *libctx,RSA *rsa,int bits,int primes,BIGNUM *e_value,BN_GENCB *cb,
              int pairwise_test)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  OSSL_CALLBACK *in_RDI;
  OSSL_LIB_CTX *in_R8;
  BIGNUM *in_R9;
  RSA *unaff_retaddr;
  void *stcbarg;
  OSSL_CALLBACK *stcb;
  int ok;
  BN_GENCB *in_stack_000000b0;
  BIGNUM *in_stack_000000b8;
  int in_stack_000000c0;
  int in_stack_000000c4;
  RSA *in_stack_000000c8;
  uint in_stack_ffffffffffffffd0;
  
  if ((in_ECX == 2) && (0x7ff < in_EDX)) {
    iVar1 = ossl_rsa_sp800_56b_generate_key
                      ((RSA *)CONCAT44(in_EDX,2),(int)((ulong)in_R8 >> 0x20),in_R9,
                       (BN_GENCB *)(ulong)in_stack_ffffffffffffffd0);
  }
  else {
    iVar1 = rsa_multiprime_keygen
                      (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000b8,
                       in_stack_000000b0);
  }
  if (((int)stcbarg != 0) && (0 < iVar1)) {
    OSSL_SELF_TEST_get_callback
              (in_R8,(OSSL_CALLBACK **)in_R9,(void **)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    iVar1 = rsa_keygen_pairwise_test(unaff_retaddr,in_RDI,in_RSI);
    if (iVar1 == 0) {
      ossl_set_error_state("Conditional_PCT");
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x38));
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x40));
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x48));
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x50));
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x58));
      BN_clear_free(*(BIGNUM **)((long)in_RSI + 0x60));
      *(undefined8 *)((long)in_RSI + 0x38) = 0;
      *(undefined8 *)((long)in_RSI + 0x40) = 0;
      *(undefined8 *)((long)in_RSI + 0x48) = 0;
      *(undefined8 *)((long)in_RSI + 0x50) = 0;
      *(undefined8 *)((long)in_RSI + 0x58) = 0;
      *(undefined8 *)((long)in_RSI + 0x60) = 0;
    }
  }
  return iVar1;
}

Assistant:

static int rsa_keygen(OSSL_LIB_CTX *libctx, RSA *rsa, int bits, int primes,
                      BIGNUM *e_value, BN_GENCB *cb, int pairwise_test)
{
    int ok = 0;

    /*
     * Only multi-prime keys or insecure keys with a small key length will use
     * the older rsa_multiprime_keygen().
     */
    if (primes == 2 && bits >= 2048)
        ok = ossl_rsa_sp800_56b_generate_key(rsa, bits, e_value, cb);
#ifndef FIPS_MODULE
    else
        ok = rsa_multiprime_keygen(rsa, bits, primes, e_value, cb);
#endif /* FIPS_MODULE */

#ifdef FIPS_MODULE
    pairwise_test = 1; /* FIPS MODE needs to always run the pairwise test */
#endif
    if (pairwise_test && ok > 0) {
        OSSL_CALLBACK *stcb = NULL;
        void *stcbarg = NULL;

        OSSL_SELF_TEST_get_callback(libctx, &stcb, &stcbarg);
        ok = rsa_keygen_pairwise_test(rsa, stcb, stcbarg);
        if (!ok) {
            ossl_set_error_state(OSSL_SELF_TEST_TYPE_PCT);
            /* Clear intermediate results */
            BN_clear_free(rsa->d);
            BN_clear_free(rsa->p);
            BN_clear_free(rsa->q);
            BN_clear_free(rsa->dmp1);
            BN_clear_free(rsa->dmq1);
            BN_clear_free(rsa->iqmp);
            rsa->d = NULL;
            rsa->p = NULL;
            rsa->q = NULL;
            rsa->dmp1 = NULL;
            rsa->dmq1 = NULL;
            rsa->iqmp = NULL;
        }
    }
    return ok;
}